

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O3

void __thiscall cppcms::widgets::checkbox::checkbox(checkbox *this)

{
  uint *puVar1;
  string local_48;
  
  base_widget::base_widget((base_widget *)&(this->super_base_html_input).field_0x60);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"checkbox","");
  base_html_input::base_html_input
            (&this->super_base_html_input,&PTR_construction_vtable_24__00287070,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  (this->super_base_html_input)._vptr_base_html_input = (_func_int **)&PTR__checkbox_00286f98;
  *(undefined ***)&(this->super_base_html_input).field_0x60 = &PTR_render_00287018;
  *(undefined8 *)&(this->super_base_html_input).field_0x30 = 0;
  *(undefined1 **)&(this->super_base_html_input).field_0x38 =
       &(this->super_base_html_input).field_0x48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->super_base_html_input).field_0x38,"y","");
  (this->super_base_html_input).field_0x58 = 0;
  puVar1 = (uint *)(&(this->super_base_html_input).field_0x1f0 +
                   (long)(this->super_base_html_input)._vptr_base_html_input[-3]);
  *puVar1 = *puVar1 | 2;
  return;
}

Assistant:

checkbox::checkbox() : 
	base_html_input("checkbox"),
	identification_("y"),
	value_(false)
{
	set(true);	
}